

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::HasItem
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,uint32 index)

{
  bool bVar1;
  IndexPropertyDescriptorMap *this_00;
  IndexPropertyDescriptor *local_30;
  IndexPropertyDescriptor *descriptor;
  ES5Array *pEStack_20;
  uint32 index_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  descriptor._4_4_ = index;
  pEStack_20 = arr;
  arr_local = (ES5Array *)this;
  this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                      (&this->indexPropertyMap);
  bVar1 = IndexPropertyDescriptorMap::TryGetReference(this_00,descriptor._4_4_,&local_30);
  if (bVar1) {
    this_local._4_4_ = (uint)(((local_30->Attributes & 8) != 0 ^ 0xffU) & 1);
  }
  else {
    this_local._4_4_ = HasDataItem(this,pEStack_20,descriptor._4_4_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::HasItem(ES5Array* arr, uint32 index)
    {
        // We have the item if we have its descriptor.
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            return !(descriptor->Attributes & PropertyDeleted);
        }

        // Otherwise check if we have such a data item.
        return HasDataItem(arr, index);
    }